

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O0

ssize_t fullread(int filedes,void *buffer,size_t nbytes)

{
  uint __errnum;
  ssize_t sVar1;
  uint *puVar2;
  char *pcVar3;
  ulong local_40;
  ssize_t nread;
  ssize_t rc;
  int error;
  size_t nbytes_local;
  void *buffer_local;
  int filedes_local;
  
  local_40 = 0;
  do {
    sVar1 = read(filedes,(void *)((long)buffer + local_40),nbytes - local_40);
    if (got_exit_signal != 0) {
      logmsg("signalled to die");
      return -1;
    }
    if (sVar1 < 0) {
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      if ((__errnum != 4) && (__errnum != 0xb)) {
        logmsg("reading from file descriptor: %d,",(ulong)(uint)filedes);
        pcVar3 = strerror(__errnum);
        logmsg("unrecoverable read() failure: (%d) %s",(ulong)__errnum,pcVar3);
        return -1;
      }
    }
    else {
      if (sVar1 == 0) {
        logmsg("got 0 reading from stdin");
        return 0;
      }
      local_40 = sVar1 + local_40;
    }
    if (nbytes <= local_40) {
      if ((verbose & 1U) != 0) {
        logmsg("read %zd bytes",local_40);
      }
      return local_40;
    }
  } while( true );
}

Assistant:

static ssize_t fullread(int filedes, void *buffer, size_t nbytes)
{
  int error;
  ssize_t rc;
  ssize_t nread = 0;

  do {
    rc = read(filedes, (unsigned char *)buffer + nread, nbytes - nread);

    if(got_exit_signal) {
      logmsg("signalled to die");
      return -1;
    }

    if(rc < 0) {
      error = errno;
      if((error == EINTR) || (error == EAGAIN))
        continue;
      logmsg("reading from file descriptor: %d,", filedes);
      logmsg("unrecoverable read() failure: (%d) %s",
             error, strerror(error));
      return -1;
    }

    if(rc == 0) {
      logmsg("got 0 reading from stdin");
      return 0;
    }

    nread += rc;

  } while((size_t)nread < nbytes);

  if(verbose)
    logmsg("read %zd bytes", nread);

  return nread;
}